

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

void __thiscall
gl3cts::ReservedNamesTest::ReservedNamesTest(ReservedNamesTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"CommonBug_ReservedNames",
             "Verifies that reserved variable names are rejected by the GL SL compiler at the compilation time."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020e2e80;
  this->m_max_fs_ssbos = 0;
  this->m_max_gs_acs = 0;
  this->m_max_gs_ssbos = 0;
  this->m_max_tc_acs = 0;
  this->m_max_tc_ssbos = 0;
  this->m_max_te_acs = 0;
  this->m_max_te_ssbos = 0;
  this->m_max_vs_acs = 0;
  this->m_max_vs_ssbos = 0;
  this->m_so_ids[0] = 0;
  this->m_so_ids[1] = 0;
  this->m_so_ids[2] = 0;
  this->m_so_ids[2] = 0;
  this->m_so_ids[3] = 0;
  this->m_so_ids[4] = 0;
  this->m_so_ids[5] = 0;
  return;
}

Assistant:

ReservedNamesTest::ReservedNamesTest(deqp::Context& context)
	: TestCase(context, "CommonBug_ReservedNames",
			   "Verifies that reserved variable names are rejected by the GL SL compiler"
			   " at the compilation time.")
	, m_max_fs_ssbos(0)
	, m_max_gs_acs(0)
	, m_max_gs_ssbos(0)
	, m_max_tc_acs(0)
	, m_max_tc_ssbos(0)
	, m_max_te_acs(0)
	, m_max_te_ssbos(0)
	, m_max_vs_acs(0)
	, m_max_vs_ssbos(0)
{
	memset(m_so_ids, 0, sizeof(m_so_ids));
}